

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::IntegrateBlock
          (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          char *blockAddress,PageSegment *segment,Recycler *recycler)

{
  size_t *psVar1;
  uint32 *puVar2;
  ushort uVar3;
  BOOL BVar4;
  uint uVar5;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  
  this_00 = &GetUnusedHeapBlock(this)->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
  if (this_00 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    BVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::SetPage
                      (this_00,blockAddress,segment,recycler);
    if (BVar4 != 0) {
      this_00->next = &this->fullBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      this->fullBlockList = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_00;
      puVar2 = &(this->super_HeapBucket).heapBlockCount;
      *puVar2 = *puVar2 + 1;
      uVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearLastFreeCount(this_00);
      uVar3 = this_00->objectSize;
      psVar1 = &(recycler->autoHeap).uncollectedAllocBytes;
      *psVar1 = *psVar1 + (ulong)(uVar5 * uVar3);
      RecyclerMemoryTracking::ReportAllocation
                (recycler,blockAddress,(ulong)((uint)this_00->objectCount * (uint)uVar3));
      this_00->isIntegratedBlock = true;
      return true;
    }
    FreeHeapBlock(this,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_00);
  }
  return false;
}

Assistant:

bool
HeapBucketT<TBlockType>::IntegrateBlock(char * blockAddress, PageSegment * segment, Recycler * recycler)
{
    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return false;
    }

    // TODO: Consider supporting guard pages for this codepath
    if (!heapBlock->SetPage(blockAddress, segment, recycler))
    {
        FreeHeapBlock(heapBlock);
        return false;
    }

    heapBlock->SetNextBlock(this->fullBlockList);
    this->fullBlockList = heapBlock;

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    this->heapBlockCount++;
#endif

    recycler->autoHeap.uncollectedAllocBytes += heapBlock->GetAndClearLastFreeCount() * heapBlock->GetObjectSize();
    RecyclerMemoryTracking::ReportAllocation(recycler, blockAddress, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    RECYCLER_PERF_COUNTER_ADD(LiveObject,heapBlock->GetObjectCount());
    RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());

    if (heapBlock->IsLargeHeapBlock())
    {
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockLiveObject,heapBlock->GetObjectCount());
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockLiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    }
    else
    {
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject,heapBlock->GetObjectCount());
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    }

#if DBG
    heapBlock->SetIsIntegratedBlock();
#endif

    return true;
}